

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8_t * google::protobuf::io::CodedOutputStream::WriteVarint64ToArray
                    (uint64_t value,uint8_t *target)

{
  uint8_t *target_local;
  uint64_t value_local;
  undefined8 local_10;
  
  value_local = (uint64_t)target;
  for (local_10 = value; 0x7f < local_10; local_10 = local_10 >> 7) {
    *(byte *)value_local = (byte)local_10 | 0x80;
    value_local = value_local + 1;
  }
  *(byte *)value_local = (byte)local_10;
  return (uint8_t *)(value_local + 1);
}

Assistant:

inline uint8_t* CodedOutputStream::WriteVarint64ToArray(uint64_t value,
                                                        uint8_t* target) {
  return EpsCopyOutputStream::UnsafeVarint(value, target);
}